

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::deinit
          (ConcurrentImageAtomicCase *this)

{
  pointer puVar1;
  pointer puVar2;
  ShaderProgram *pSVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  int ndx;
  long lVar6;
  
  if (this->m_imageID != 0) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x480))(1,&this->m_imageID);
    this->m_imageID = 0;
  }
  lVar5 = 0;
  lVar6 = 0;
  while( true ) {
    puVar1 = (this->m_intermediateResultBuffers).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_intermediateResultBuffers).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)puVar2 - (long)puVar1) >> 2) <= lVar6) break;
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x438))
              (1,(long)(this->m_intermediateResultBuffers).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 4;
  }
  if (puVar2 != puVar1) {
    (this->m_intermediateResultBuffers).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  pSVar3 = this->m_program;
  if (pSVar3 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar3);
  }
  operator_delete(pSVar3,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  pSVar3 = this->m_imageReadProgram;
  if (pSVar3 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar3);
  }
  operator_delete(pSVar3,0xd0);
  this->m_imageReadProgram = (ShaderProgram *)0x0;
  pSVar3 = this->m_imageClearProgram;
  if (pSVar3 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar3);
  }
  operator_delete(pSVar3,0xd0);
  this->m_imageClearProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

void ConcurrentImageAtomicCase::deinit (void)
{
	if (m_imageID)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_imageID);
		m_imageID = 0;
	}

	for (int ndx = 0; ndx < (int)m_intermediateResultBuffers.size(); ++ndx)
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_intermediateResultBuffers[ndx]);
	m_intermediateResultBuffers.clear();

	delete m_program;
	m_program = DE_NULL;

	delete m_imageReadProgram;
	m_imageReadProgram = DE_NULL;

	delete m_imageClearProgram;
	m_imageClearProgram = DE_NULL;
}